

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  int iVar34;
  long lVar35;
  long lVar36;
  byte bVar37;
  uint uVar38;
  ulong uVar39;
  byte bVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  bool bVar47;
  ulong uVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined4 uVar85;
  undefined1 auVar86 [32];
  float fVar87;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar88 [32];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2888;
  ulong *local_2878;
  undefined1 local_2840 [16];
  Geometry *local_2830;
  ulong local_2828;
  long local_2820;
  long local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  RTCHitN local_2690 [16];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined4 local_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  uint local_2620;
  uint uStack_261c;
  uint uStack_2618;
  uint uStack_2614;
  uint uStack_2610;
  uint uStack_260c;
  uint uStack_2608;
  uint uStack_2604;
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar54 [32];
  
  local_2878 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar112 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar113 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar114 = ZEXT3264(local_2780);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar95 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar87 * 0.99999964)));
  auVar115 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar95 * 0.99999964)));
  auVar116 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar102 * 0.99999964)));
  auVar117 = ZEXT3264(local_27e0);
  fVar87 = fVar87 * 1.0000004;
  fVar95 = fVar95 * 1.0000004;
  fVar102 = fVar102 * 1.0000004;
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar45 = uVar43 ^ 0x20;
  iVar1 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar1;
  local_2600._0_4_ = iVar1;
  local_2600._8_4_ = iVar1;
  local_2600._12_4_ = iVar1;
  local_2600._16_4_ = iVar1;
  local_2600._20_4_ = iVar1;
  local_2600._24_4_ = iVar1;
  local_2600._28_4_ = iVar1;
  auVar109 = ZEXT3264(local_2600);
  iVar1 = (tray->tfar).field_0.i[k];
  auVar77 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar49 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar110 = ZEXT3264(auVar49);
  auVar111 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_25a0 = fVar87;
  fStack_259c = fVar87;
  fStack_2598 = fVar87;
  fStack_2594 = fVar87;
  fStack_2590 = fVar87;
  fStack_258c = fVar87;
  fStack_2588 = fVar87;
  fStack_2584 = fVar87;
  local_25c0 = fVar95;
  fStack_25bc = fVar95;
  fStack_25b8 = fVar95;
  fStack_25b4 = fVar95;
  fStack_25b0 = fVar95;
  fStack_25ac = fVar95;
  fStack_25a8 = fVar95;
  fStack_25a4 = fVar95;
  local_25e0 = fVar102;
  fStack_25dc = fVar102;
  fStack_25d8 = fVar102;
  fStack_25d4 = fVar102;
  fStack_25d0 = fVar102;
  fStack_25cc = fVar102;
  fStack_25c8 = fVar102;
  fStack_25c4 = fVar102;
  fVar89 = fVar87;
  fVar90 = fVar87;
  fVar91 = fVar87;
  fVar92 = fVar87;
  fVar93 = fVar87;
  fVar94 = fVar87;
  fVar96 = fVar95;
  fVar97 = fVar95;
  fVar98 = fVar95;
  fVar99 = fVar95;
  fVar100 = fVar95;
  fVar101 = fVar95;
  fVar103 = fVar102;
  fVar104 = fVar102;
  fVar105 = fVar102;
  fVar106 = fVar102;
  fVar107 = fVar102;
  fVar108 = fVar102;
  local_2828 = uVar43;
LAB_01db6c24:
  do {
    if (local_2878 == &local_23a0) {
      return;
    }
    pfVar5 = (float *)(local_2878 + -1);
    local_2878 = local_2878 + -2;
  } while (*(float *)(ray + k * 4 + 0x80) < *pfVar5);
  uVar46 = *local_2878;
LAB_01db6c53:
  do {
    if ((uVar46 & 8) != 0) break;
    auVar49 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar44),auVar112._0_32_);
    auVar49 = vmulps_avx512vl(auVar115._0_32_,auVar49);
    auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar43),auVar113._0_32_);
    auVar50 = vmulps_avx512vl(auVar116._0_32_,auVar50);
    auVar49 = vmaxps_avx(auVar49,auVar50);
    auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar39),auVar114._0_32_);
    auVar50 = vmulps_avx512vl(auVar117._0_32_,auVar50);
    auVar50 = vmaxps_avx(auVar50,auVar109._0_32_);
    auVar49 = vmaxps_avx(auVar49,auVar50);
    auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar44 ^ 0x20)),
                              auVar112._0_32_);
    auVar28._4_4_ = fVar89 * auVar50._4_4_;
    auVar28._0_4_ = fVar87 * auVar50._0_4_;
    auVar28._8_4_ = fVar90 * auVar50._8_4_;
    auVar28._12_4_ = fVar91 * auVar50._12_4_;
    auVar28._16_4_ = fVar92 * auVar50._16_4_;
    auVar28._20_4_ = fVar93 * auVar50._20_4_;
    auVar28._24_4_ = fVar94 * auVar50._24_4_;
    auVar28._28_4_ = auVar50._28_4_;
    auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar45),auVar113._0_32_);
    auVar29._4_4_ = fVar96 * auVar50._4_4_;
    auVar29._0_4_ = fVar95 * auVar50._0_4_;
    auVar29._8_4_ = fVar97 * auVar50._8_4_;
    auVar29._12_4_ = fVar98 * auVar50._12_4_;
    auVar29._16_4_ = fVar99 * auVar50._16_4_;
    auVar29._20_4_ = fVar100 * auVar50._20_4_;
    auVar29._24_4_ = fVar101 * auVar50._24_4_;
    auVar29._28_4_ = auVar50._28_4_;
    auVar50 = vminps_avx(auVar28,auVar29);
    auVar51 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar39 ^ 0x20)),
                              auVar114._0_32_);
    auVar30._4_4_ = fVar103 * auVar51._4_4_;
    auVar30._0_4_ = fVar102 * auVar51._0_4_;
    auVar30._8_4_ = fVar104 * auVar51._8_4_;
    auVar30._12_4_ = fVar105 * auVar51._12_4_;
    auVar30._16_4_ = fVar106 * auVar51._16_4_;
    auVar30._20_4_ = fVar107 * auVar51._20_4_;
    auVar30._24_4_ = fVar108 * auVar51._24_4_;
    auVar30._28_4_ = auVar51._28_4_;
    auVar51 = vminps_avx(auVar30,auVar77._0_32_);
    auVar50 = vminps_avx(auVar50,auVar51);
    uVar48 = vcmpps_avx512vl(auVar49,auVar50,2);
    bVar40 = (byte)uVar48;
    if (bVar40 == 0) goto LAB_01db6c24;
    auVar50 = *(undefined1 (*) [32])(uVar46 & 0xfffffffffffffff0);
    auVar51 = ((undefined1 (*) [32])(uVar46 & 0xfffffffffffffff0))[1];
    auVar52 = vpternlogd_avx512vl(auVar110._0_32_,auVar49,auVar111._0_32_,0xf8);
    auVar53 = vpcompressd_avx512vl(auVar52);
    auVar54._0_4_ = (uint)(bVar40 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar40 & 1) * auVar52._0_4_;
    bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
    auVar54._4_4_ = (uint)bVar47 * auVar53._4_4_ | (uint)!bVar47 * auVar52._4_4_;
    bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
    auVar54._8_4_ = (uint)bVar47 * auVar53._8_4_ | (uint)!bVar47 * auVar52._8_4_;
    bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
    auVar54._12_4_ = (uint)bVar47 * auVar53._12_4_ | (uint)!bVar47 * auVar52._12_4_;
    bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
    auVar54._16_4_ = (uint)bVar47 * auVar53._16_4_ | (uint)!bVar47 * auVar52._16_4_;
    bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
    auVar54._20_4_ = (uint)bVar47 * auVar53._20_4_ | (uint)!bVar47 * auVar52._20_4_;
    bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
    auVar54._24_4_ = (uint)bVar47 * auVar53._24_4_ | (uint)!bVar47 * auVar52._24_4_;
    bVar47 = SUB81(uVar48 >> 7,0);
    auVar54._28_4_ = (uint)bVar47 * auVar53._28_4_ | (uint)!bVar47 * auVar52._28_4_;
    auVar52 = vpermt2q_avx512vl(auVar50,auVar54,auVar51);
    uVar46 = auVar52._0_8_;
    bVar40 = bVar40 - 1 & bVar40;
    if (bVar40 != 0) {
      auVar52 = vpshufd_avx2(auVar54,0x55);
      vpermt2q_avx512vl(auVar50,auVar52,auVar51);
      auVar53 = vpminsd_avx2(auVar54,auVar52);
      auVar52 = vpmaxsd_avx2(auVar54,auVar52);
      bVar40 = bVar40 - 1 & bVar40;
      if (bVar40 == 0) {
        auVar53 = vpermi2q_avx512vl(auVar53,auVar50,auVar51);
        uVar46 = auVar53._0_8_;
        auVar50 = vpermt2q_avx512vl(auVar50,auVar52,auVar51);
        *local_2878 = auVar50._0_8_;
        lVar35 = 8;
        lStack_2888 = 0x10;
      }
      else {
        auVar69 = vpshufd_avx2(auVar54,0xaa);
        vpermt2q_avx512vl(auVar50,auVar69,auVar51);
        auVar55 = vpminsd_avx2(auVar53,auVar69);
        auVar53 = vpmaxsd_avx2(auVar53,auVar69);
        auVar69 = vpminsd_avx2(auVar52,auVar53);
        auVar53 = vpmaxsd_avx2(auVar52,auVar53);
        bVar40 = bVar40 - 1 & bVar40;
        if (bVar40 == 0) {
          auVar52 = vpermi2q_avx512vl(auVar55,auVar50,auVar51);
          uVar46 = auVar52._0_8_;
          auVar52 = vpermt2q_avx512vl(auVar50,auVar53,auVar51);
          *local_2878 = auVar52._0_8_;
          auVar52 = vpermd_avx2(auVar53,auVar49);
          *(int *)(local_2878 + 1) = auVar52._0_4_;
          auVar50 = vpermt2q_avx512vl(auVar50,auVar69,auVar51);
          local_2878[2] = auVar50._0_8_;
          lStack_2888 = 0x18;
          lVar35 = lStack_2888;
          lStack_2888 = 0x20;
          auVar52 = auVar69;
        }
        else {
          auVar52 = vpshufd_avx2(auVar54,0xff);
          vpermt2q_avx512vl(auVar50,auVar52,auVar51);
          auVar57 = vpminsd_avx2(auVar55,auVar52);
          auVar55 = vpmaxsd_avx2(auVar55,auVar52);
          auVar52 = vpminsd_avx2(auVar69,auVar55);
          auVar55 = vpmaxsd_avx2(auVar69,auVar55);
          auVar69 = vpminsd_avx2(auVar53,auVar55);
          auVar53 = vpmaxsd_avx2(auVar53,auVar55);
          bVar40 = bVar40 - 1 & bVar40;
          if (bVar40 != 0) {
            auVar56 = valignd_avx512vl(auVar54,auVar54,3);
            auVar55 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar57 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                           CONCAT48(0x80000000,0x8000000080000000)))
                                        ,auVar55,auVar57);
            auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
            auVar52 = vpermt2d_avx512vl(auVar57,auVar55,auVar52);
            auVar55 = vpermt2d_avx512vl(auVar52,auVar55,auVar69);
            auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
            auVar52 = vpermt2d_avx512vl(auVar55,auVar52,auVar53);
            auVar112 = ZEXT3264(auVar52);
            bVar37 = bVar40;
            do {
              auVar53 = auVar112._0_32_;
              auVar79._8_4_ = 1;
              auVar79._0_8_ = 0x100000001;
              auVar79._12_4_ = 1;
              auVar79._16_4_ = 1;
              auVar79._20_4_ = 1;
              auVar79._24_4_ = 1;
              auVar79._28_4_ = 1;
              auVar52 = vpermd_avx2(auVar79,auVar56);
              auVar56 = valignd_avx512vl(auVar56,auVar56,1);
              vpermt2q_avx512vl(auVar50,auVar56,auVar51);
              bVar37 = bVar37 - 1 & bVar37;
              uVar25 = vpcmpd_avx512vl(auVar52,auVar53,5);
              auVar52 = vpmaxsd_avx2(auVar52,auVar53);
              bVar26 = (byte)uVar25 << 1;
              auVar53 = valignd_avx512vl(auVar53,auVar53,7);
              bVar47 = (bool)((byte)uVar25 & 1);
              bVar10 = (bool)(bVar26 >> 2 & 1);
              bVar11 = (bool)(bVar26 >> 3 & 1);
              bVar12 = (bool)(bVar26 >> 4 & 1);
              bVar13 = (bool)(bVar26 >> 5 & 1);
              bVar14 = (bool)(bVar26 >> 6 & 1);
              auVar112 = ZEXT3264(CONCAT428((uint)(bVar26 >> 7) * auVar53._28_4_ |
                                            (uint)!(bool)(bVar26 >> 7) * auVar52._28_4_,
                                            CONCAT424((uint)bVar14 * auVar53._24_4_ |
                                                      (uint)!bVar14 * auVar52._24_4_,
                                                      CONCAT420((uint)bVar13 * auVar53._20_4_ |
                                                                (uint)!bVar13 * auVar52._20_4_,
                                                                CONCAT416((uint)bVar12 *
                                                                          auVar53._16_4_ |
                                                                          (uint)!bVar12 *
                                                                          auVar52._16_4_,
                                                                          CONCAT412((uint)bVar11 *
                                                                                    auVar53._12_4_ |
                                                                                    (uint)!bVar11 *
                                                                                    auVar52._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar10 * auVar53._8_4_ |
                                                  (uint)!bVar10 * auVar52._8_4_,
                                                  CONCAT44((uint)bVar47 * auVar53._4_4_ |
                                                           (uint)!bVar47 * auVar52._4_4_,
                                                           auVar52._0_4_))))))));
            } while (bVar37 != 0);
            lVar35 = (ulong)(uint)POPCOUNT((uint)bVar40) + 3;
            while( true ) {
              auVar53 = auVar112._0_32_;
              auVar52 = vpermt2q_avx512vl(auVar50,auVar53,auVar51);
              uVar46 = auVar52._0_8_;
              bVar47 = lVar35 == 0;
              lVar35 = lVar35 + -1;
              if (bVar47) break;
              *local_2878 = uVar46;
              auVar52 = vpermd_avx2(auVar53,auVar49);
              *(int *)(local_2878 + 1) = auVar52._0_4_;
              auVar52 = valignd_avx512vl(auVar53,auVar53,1);
              auVar112 = ZEXT3264(auVar52);
              local_2878 = local_2878 + 2;
            }
            auVar112 = ZEXT3264(local_2740);
            auVar113 = ZEXT3264(local_2760);
            auVar114 = ZEXT3264(local_2780);
            auVar115 = ZEXT3264(local_27a0);
            auVar116 = ZEXT3264(local_27c0);
            auVar117 = ZEXT3264(local_27e0);
            goto LAB_01db6c53;
          }
          auVar55 = vpermi2q_avx512vl(auVar57,auVar50,auVar51);
          uVar46 = auVar55._0_8_;
          auVar55 = vpermt2q_avx512vl(auVar50,auVar53,auVar51);
          *local_2878 = auVar55._0_8_;
          auVar53 = vpermd_avx2(auVar53,auVar49);
          *(int *)(local_2878 + 1) = auVar53._0_4_;
          auVar53 = vpermt2q_avx512vl(auVar50,auVar69,auVar51);
          local_2878[2] = auVar53._0_8_;
          auVar53 = vpermd_avx2(auVar69,auVar49);
          *(int *)(local_2878 + 3) = auVar53._0_4_;
          auVar50 = vpermt2q_avx512vl(auVar50,auVar52,auVar51);
          local_2878[4] = auVar50._0_8_;
          lVar35 = 0x28;
          lStack_2888 = 0x30;
        }
      }
      auVar49 = vpermd_avx2(auVar52,auVar49);
      *(int *)((long)local_2878 + lVar35) = auVar49._0_4_;
      local_2878 = (ulong *)((long)local_2878 + lStack_2888);
    }
  } while( true );
  local_2820 = (ulong)((uint)uVar46 & 0xf) - 8;
  uVar46 = uVar46 & 0xfffffffffffffff0;
  for (local_2818 = 0; local_2818 != local_2820; local_2818 = local_2818 + 1) {
    lVar36 = local_2818 * 0x60;
    pSVar3 = context->scene;
    ppfVar4 = (pSVar3->vertices).items;
    pfVar5 = ppfVar4[*(uint *)(uVar46 + 0x48 + lVar36)];
    auVar51._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 0x28 + lVar36));
    auVar51._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 8 + lVar36));
    pfVar6 = ppfVar4[*(uint *)(uVar46 + 0x40 + lVar36)];
    auVar58._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + 0x20 + lVar36));
    auVar58._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + lVar36));
    pfVar7 = ppfVar4[*(uint *)(uVar46 + 0x4c + lVar36)];
    auVar59._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x2c + lVar36));
    auVar59._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0xc + lVar36));
    pfVar8 = ppfVar4[*(uint *)(uVar46 + 0x44 + lVar36)];
    auVar64._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x24 + lVar36));
    auVar64._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 4 + lVar36));
    lVar35 = uVar46 + 0x40 + lVar36;
    local_2580 = *(undefined8 *)(lVar35 + 0x10);
    uStack_2578 = *(undefined8 *)(lVar35 + 0x18);
    uStack_2570 = local_2580;
    uStack_2568 = uStack_2578;
    lVar35 = uVar46 + 0x50 + lVar36;
    local_26c0 = *(undefined8 *)(lVar35 + 0x10);
    uStack_26b8 = *(undefined8 *)(lVar35 + 0x18);
    auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 0x18 + lVar36)));
    auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 0x18 + lVar36)));
    auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x1c + lVar36)));
    auVar16 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x1c + lVar36)));
    auVar19 = vunpcklps_avx(auVar15,auVar16);
    auVar20 = vunpcklps_avx(auVar17,auVar18);
    auVar15 = vunpckhps_avx(auVar17,auVar18);
    auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + 0x30 + lVar36)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 0x38 + lVar36)));
    auVar16 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar46 + 0x30 + lVar36)),
                            *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar46 + 0x38 + lVar36)));
    auVar21 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x34 + lVar36)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x3c + lVar36)));
    auVar17 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar46 + 0x34 + lVar36)),
                            *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar46 + 0x3c + lVar36)));
    auVar17 = vunpcklps_avx(auVar16,auVar17);
    auVar22 = vunpcklps_avx(auVar18,auVar21);
    auVar16 = vunpckhps_avx(auVar18,auVar21);
    uStack_26b0 = local_26c0;
    uStack_26a8 = uStack_26b8;
    auVar49 = vunpcklps_avx(auVar64,auVar59);
    auVar50 = vunpcklps_avx(auVar58,auVar51);
    auVar52 = vunpcklps_avx(auVar50,auVar49);
    auVar50 = vunpckhps_avx(auVar50,auVar49);
    auVar49 = vunpckhps_avx(auVar64,auVar59);
    auVar51 = vunpckhps_avx(auVar58,auVar51);
    auVar51 = vunpcklps_avx(auVar51,auVar49);
    auVar60._16_16_ = auVar20;
    auVar60._0_16_ = auVar20;
    auVar63._16_16_ = auVar15;
    auVar63._0_16_ = auVar15;
    auVar61._16_16_ = auVar19;
    auVar61._0_16_ = auVar19;
    auVar65._16_16_ = auVar22;
    auVar65._0_16_ = auVar22;
    auVar66._16_16_ = auVar16;
    auVar66._0_16_ = auVar16;
    uVar85 = *(undefined4 *)(ray + k * 4);
    auVar67._4_4_ = uVar85;
    auVar67._0_4_ = uVar85;
    auVar67._8_4_ = uVar85;
    auVar67._12_4_ = uVar85;
    auVar67._16_4_ = uVar85;
    auVar67._20_4_ = uVar85;
    auVar67._24_4_ = uVar85;
    auVar67._28_4_ = uVar85;
    auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
    auVar55 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
    uVar85 = *(undefined4 *)(ray + k * 4 + 0x40);
    auVar80._4_4_ = uVar85;
    auVar80._0_4_ = uVar85;
    auVar80._8_4_ = uVar85;
    auVar80._12_4_ = uVar85;
    auVar80._16_4_ = uVar85;
    auVar80._20_4_ = uVar85;
    auVar80._24_4_ = uVar85;
    auVar80._28_4_ = uVar85;
    auVar62._16_16_ = auVar17;
    auVar62._0_16_ = auVar17;
    uVar85 = *(undefined4 *)(ray + k * 4 + 0x50);
    auVar83._4_4_ = uVar85;
    auVar83._0_4_ = uVar85;
    auVar83._8_4_ = uVar85;
    auVar83._12_4_ = uVar85;
    auVar83._16_4_ = uVar85;
    auVar83._20_4_ = uVar85;
    auVar83._24_4_ = uVar85;
    auVar83._28_4_ = uVar85;
    fVar87 = *(float *)(ray + k * 4 + 0x60);
    auVar88._4_4_ = fVar87;
    auVar88._0_4_ = fVar87;
    auVar88._8_4_ = fVar87;
    auVar88._12_4_ = fVar87;
    auVar88._16_4_ = fVar87;
    auVar88._20_4_ = fVar87;
    auVar88._24_4_ = fVar87;
    auVar88._28_4_ = fVar87;
    auVar49 = vsubps_avx(auVar52,auVar67);
    auVar58 = vsubps_avx512vl(auVar50,auVar53);
    auVar59 = vsubps_avx512vl(auVar51,auVar55);
    auVar56 = vsubps_avx512vl(auVar60,auVar67);
    auVar60 = vsubps_avx512vl(auVar63,auVar53);
    auVar61 = vsubps_avx512vl(auVar61,auVar55);
    auVar50 = vsubps_avx(auVar65,auVar67);
    auVar53 = vsubps_avx512vl(auVar66,auVar53);
    auVar55 = vsubps_avx512vl(auVar62,auVar55);
    auVar51 = vsubps_avx(auVar50,auVar49);
    auVar52 = vsubps_avx(auVar53,auVar58);
    auVar62 = vsubps_avx512vl(auVar55,auVar59);
    auVar63 = vsubps_avx512vl(auVar49,auVar56);
    auVar64 = vsubps_avx512vl(auVar58,auVar60);
    auVar65 = vsubps_avx512vl(auVar59,auVar61);
    auVar66 = vsubps_avx512vl(auVar56,auVar50);
    auVar67 = vsubps_avx512vl(auVar60,auVar53);
    auVar68 = vsubps_avx512vl(auVar61,auVar55);
    auVar71._0_4_ = auVar50._0_4_ + auVar49._0_4_;
    auVar71._4_4_ = auVar50._4_4_ + auVar49._4_4_;
    auVar71._8_4_ = auVar50._8_4_ + auVar49._8_4_;
    auVar71._12_4_ = auVar50._12_4_ + auVar49._12_4_;
    auVar71._16_4_ = auVar50._16_4_ + auVar49._16_4_;
    auVar71._20_4_ = auVar50._20_4_ + auVar49._20_4_;
    auVar71._24_4_ = auVar50._24_4_ + auVar49._24_4_;
    auVar71._28_4_ = auVar50._28_4_ + auVar49._28_4_;
    auVar82._0_4_ = auVar53._0_4_ + auVar58._0_4_;
    auVar82._4_4_ = auVar53._4_4_ + auVar58._4_4_;
    auVar82._8_4_ = auVar53._8_4_ + auVar58._8_4_;
    auVar82._12_4_ = auVar53._12_4_ + auVar58._12_4_;
    auVar82._16_4_ = auVar53._16_4_ + auVar58._16_4_;
    auVar82._20_4_ = auVar53._20_4_ + auVar58._20_4_;
    auVar82._24_4_ = auVar53._24_4_ + auVar58._24_4_;
    auVar82._28_4_ = auVar53._28_4_ + auVar58._28_4_;
    auVar69 = vaddps_avx512vl(auVar55,auVar59);
    auVar57 = vmulps_avx512vl(auVar82,auVar62);
    auVar57 = vfmsub231ps_avx512vl(auVar57,auVar52,auVar69);
    auVar69 = vmulps_avx512vl(auVar69,auVar51);
    auVar70 = vfmsub231ps_avx512vl(auVar69,auVar62,auVar71);
    auVar69._4_4_ = auVar52._4_4_ * auVar71._4_4_;
    auVar69._0_4_ = auVar52._0_4_ * auVar71._0_4_;
    auVar69._8_4_ = auVar52._8_4_ * auVar71._8_4_;
    auVar69._12_4_ = auVar52._12_4_ * auVar71._12_4_;
    auVar69._16_4_ = auVar52._16_4_ * auVar71._16_4_;
    auVar69._20_4_ = auVar52._20_4_ * auVar71._20_4_;
    auVar69._24_4_ = auVar52._24_4_ * auVar71._24_4_;
    auVar69._28_4_ = auVar71._28_4_;
    auVar15 = vfmsub231ps_fma(auVar69,auVar51,auVar82);
    auVar78._0_4_ = fVar87 * auVar15._0_4_;
    auVar78._4_4_ = fVar87 * auVar15._4_4_;
    auVar78._8_4_ = fVar87 * auVar15._8_4_;
    auVar78._12_4_ = fVar87 * auVar15._12_4_;
    auVar78._16_4_ = fVar87 * 0.0;
    auVar78._20_4_ = fVar87 * 0.0;
    auVar78._24_4_ = fVar87 * 0.0;
    auVar78._28_4_ = 0;
    auVar69 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar70);
    local_2560 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar57);
    auVar69 = vaddps_avx512vl(auVar49,auVar56);
    auVar57 = vaddps_avx512vl(auVar58,auVar60);
    auVar70 = vaddps_avx512vl(auVar59,auVar61);
    auVar71 = vmulps_avx512vl(auVar57,auVar65);
    auVar71 = vfmsub231ps_avx512vl(auVar71,auVar64,auVar70);
    auVar70 = vmulps_avx512vl(auVar70,auVar63);
    auVar70 = vfmsub231ps_avx512vl(auVar70,auVar65,auVar69);
    auVar69 = vmulps_avx512vl(auVar69,auVar64);
    auVar69 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar57);
    auVar57._4_4_ = fVar87 * auVar69._4_4_;
    auVar57._0_4_ = fVar87 * auVar69._0_4_;
    auVar57._8_4_ = fVar87 * auVar69._8_4_;
    auVar57._12_4_ = fVar87 * auVar69._12_4_;
    auVar57._16_4_ = fVar87 * auVar69._16_4_;
    auVar57._20_4_ = fVar87 * auVar69._20_4_;
    auVar57._24_4_ = fVar87 * auVar69._24_4_;
    auVar57._28_4_ = auVar69._28_4_;
    auVar69 = vfmadd231ps_avx512vl(auVar57,auVar83,auVar70);
    local_2540 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar71);
    auVar50 = vaddps_avx512vl(auVar56,auVar50);
    auVar53 = vaddps_avx512vl(auVar60,auVar53);
    auVar55 = vaddps_avx512vl(auVar61,auVar55);
    auVar69 = vmulps_avx512vl(auVar53,auVar68);
    auVar69 = vfmsub231ps_avx512vl(auVar69,auVar67,auVar55);
    auVar55 = vmulps_avx512vl(auVar55,auVar66);
    auVar55 = vfmsub231ps_avx512vl(auVar55,auVar68,auVar50);
    auVar56._4_4_ = auVar50._4_4_ * auVar67._4_4_;
    auVar56._0_4_ = auVar50._0_4_ * auVar67._0_4_;
    auVar56._8_4_ = auVar50._8_4_ * auVar67._8_4_;
    auVar56._12_4_ = auVar50._12_4_ * auVar67._12_4_;
    auVar56._16_4_ = auVar50._16_4_ * auVar67._16_4_;
    auVar56._20_4_ = auVar50._20_4_ * auVar67._20_4_;
    auVar56._24_4_ = auVar50._24_4_ * auVar67._24_4_;
    auVar56._28_4_ = auVar50._28_4_;
    auVar15 = vfmsub231ps_fma(auVar56,auVar66,auVar53);
    auVar50 = vmulps_avx512vl(ZEXT1632(auVar15),auVar88);
    auVar50 = vfmadd231ps_avx512vl(auVar50,auVar83,auVar55);
    auVar69 = vfmadd231ps_avx512vl(auVar50,auVar80,auVar69);
    auVar70._0_4_ = local_2560._0_4_ + local_2540._0_4_;
    auVar70._4_4_ = local_2560._4_4_ + local_2540._4_4_;
    auVar70._8_4_ = local_2560._8_4_ + local_2540._8_4_;
    auVar70._12_4_ = local_2560._12_4_ + local_2540._12_4_;
    auVar70._16_4_ = local_2560._16_4_ + local_2540._16_4_;
    auVar70._20_4_ = local_2560._20_4_ + local_2540._20_4_;
    auVar70._24_4_ = local_2560._24_4_ + local_2540._24_4_;
    auVar70._28_4_ = local_2560._28_4_ + local_2540._28_4_;
    local_2520 = vaddps_avx512vl(auVar69,auVar70);
    auVar50._8_4_ = 0x7fffffff;
    auVar50._0_8_ = 0x7fffffff7fffffff;
    auVar50._12_4_ = 0x7fffffff;
    auVar50._16_4_ = 0x7fffffff;
    auVar50._20_4_ = 0x7fffffff;
    auVar50._24_4_ = 0x7fffffff;
    auVar50._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar50);
    auVar53._8_4_ = 0x34000000;
    auVar53._0_8_ = 0x3400000034000000;
    auVar53._12_4_ = 0x34000000;
    auVar53._16_4_ = 0x34000000;
    auVar53._20_4_ = 0x34000000;
    auVar53._24_4_ = 0x34000000;
    auVar53._28_4_ = 0x34000000;
    auVar50 = vmulps_avx512vl(local_2520,auVar53);
    auVar53 = vminps_avx512vl(local_2560,local_2540);
    auVar53 = vminps_avx512vl(auVar53,auVar69);
    auVar55._8_4_ = 0x80000000;
    auVar55._0_8_ = 0x8000000080000000;
    auVar55._12_4_ = 0x80000000;
    auVar55._16_4_ = 0x80000000;
    auVar55._20_4_ = 0x80000000;
    auVar55._24_4_ = 0x80000000;
    auVar55._28_4_ = 0x80000000;
    auVar55 = vxorps_avx512vl(auVar50,auVar55);
    uVar25 = vcmpps_avx512vl(auVar53,auVar55,5);
    auVar53 = vmaxps_avx512vl(local_2560,local_2540);
    auVar53 = vmaxps_avx512vl(auVar53,auVar69);
    uVar23 = vcmpps_avx512vl(auVar53,auVar50,2);
    bVar40 = (byte)uVar25 | (byte)uVar23;
    if (bVar40 != 0) {
      auVar50 = vmulps_avx512vl(auVar64,auVar62);
      auVar53 = vmulps_avx512vl(auVar51,auVar65);
      auVar55 = vmulps_avx512vl(auVar63,auVar52);
      auVar69 = vmulps_avx512vl(auVar67,auVar65);
      auVar57 = vmulps_avx512vl(auVar63,auVar68);
      auVar56 = vmulps_avx512vl(auVar66,auVar64);
      auVar52 = vfmsub213ps_avx512vl(auVar52,auVar65,auVar50);
      auVar60 = vfmsub213ps_avx512vl(auVar62,auVar63,auVar53);
      auVar51 = vfmsub213ps_avx512vl(auVar51,auVar64,auVar55);
      auVar61 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar69);
      auVar62 = vfmsub213ps_avx512vl(auVar66,auVar65,auVar57);
      auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar56);
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar50,auVar64);
      vandps_avx512vl(auVar69,auVar64);
      uVar43 = vcmpps_avx512vl(auVar64,auVar64,1);
      vandps_avx512vl(auVar53,auVar64);
      vandps_avx512vl(auVar57,auVar64);
      uVar48 = vcmpps_avx512vl(auVar64,auVar64,1);
      vandps_avx512vl(auVar55,auVar64);
      vandps_avx512vl(auVar56,auVar64);
      uVar24 = vcmpps_avx512vl(auVar64,auVar64,1);
      bVar47 = (bool)((byte)uVar43 & 1);
      local_2500._0_4_ = (float)((uint)bVar47 * auVar52._0_4_ | (uint)!bVar47 * auVar61._0_4_);
      bVar47 = (bool)((byte)(uVar43 >> 1) & 1);
      local_2500._4_4_ = (float)((uint)bVar47 * auVar52._4_4_ | (uint)!bVar47 * auVar61._4_4_);
      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
      local_2500._8_4_ = (float)((uint)bVar47 * auVar52._8_4_ | (uint)!bVar47 * auVar61._8_4_);
      bVar47 = (bool)((byte)(uVar43 >> 3) & 1);
      local_2500._12_4_ = (float)((uint)bVar47 * auVar52._12_4_ | (uint)!bVar47 * auVar61._12_4_);
      bVar47 = (bool)((byte)(uVar43 >> 4) & 1);
      local_2500._16_4_ = (float)((uint)bVar47 * auVar52._16_4_ | (uint)!bVar47 * auVar61._16_4_);
      bVar47 = (bool)((byte)(uVar43 >> 5) & 1);
      local_2500._20_4_ = (float)((uint)bVar47 * auVar52._20_4_ | (uint)!bVar47 * auVar61._20_4_);
      bVar47 = (bool)((byte)(uVar43 >> 6) & 1);
      local_2500._24_4_ = (float)((uint)bVar47 * auVar52._24_4_ | (uint)!bVar47 * auVar61._24_4_);
      bVar47 = SUB81(uVar43 >> 7,0);
      local_2500._28_4_ = (uint)bVar47 * auVar52._28_4_ | (uint)!bVar47 * auVar61._28_4_;
      bVar47 = (bool)((byte)uVar48 & 1);
      local_24e0._0_4_ = (float)((uint)bVar47 * auVar60._0_4_ | (uint)!bVar47 * auVar62._0_4_);
      bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
      local_24e0._4_4_ = (float)((uint)bVar47 * auVar60._4_4_ | (uint)!bVar47 * auVar62._4_4_);
      bVar47 = (bool)((byte)(uVar48 >> 2) & 1);
      local_24e0._8_4_ = (float)((uint)bVar47 * auVar60._8_4_ | (uint)!bVar47 * auVar62._8_4_);
      bVar47 = (bool)((byte)(uVar48 >> 3) & 1);
      local_24e0._12_4_ = (float)((uint)bVar47 * auVar60._12_4_ | (uint)!bVar47 * auVar62._12_4_);
      bVar47 = (bool)((byte)(uVar48 >> 4) & 1);
      local_24e0._16_4_ = (float)((uint)bVar47 * auVar60._16_4_ | (uint)!bVar47 * auVar62._16_4_);
      bVar47 = (bool)((byte)(uVar48 >> 5) & 1);
      local_24e0._20_4_ = (float)((uint)bVar47 * auVar60._20_4_ | (uint)!bVar47 * auVar62._20_4_);
      bVar47 = (bool)((byte)(uVar48 >> 6) & 1);
      local_24e0._24_4_ = (float)((uint)bVar47 * auVar60._24_4_ | (uint)!bVar47 * auVar62._24_4_);
      bVar47 = SUB81(uVar48 >> 7,0);
      local_24e0._28_4_ = (uint)bVar47 * auVar60._28_4_ | (uint)!bVar47 * auVar62._28_4_;
      bVar47 = (bool)((byte)uVar24 & 1);
      local_24c0 = (float)((uint)bVar47 * auVar51._0_4_ | (uint)!bVar47 * auVar63._0_4_);
      bVar47 = (bool)((byte)(uVar24 >> 1) & 1);
      fStack_24bc = (float)((uint)bVar47 * auVar51._4_4_ | (uint)!bVar47 * auVar63._4_4_);
      bVar47 = (bool)((byte)(uVar24 >> 2) & 1);
      fStack_24b8 = (float)((uint)bVar47 * auVar51._8_4_ | (uint)!bVar47 * auVar63._8_4_);
      bVar47 = (bool)((byte)(uVar24 >> 3) & 1);
      fStack_24b4 = (float)((uint)bVar47 * auVar51._12_4_ | (uint)!bVar47 * auVar63._12_4_);
      bVar47 = (bool)((byte)(uVar24 >> 4) & 1);
      fStack_24b0 = (float)((uint)bVar47 * auVar51._16_4_ | (uint)!bVar47 * auVar63._16_4_);
      bVar47 = (bool)((byte)(uVar24 >> 5) & 1);
      fStack_24ac = (float)((uint)bVar47 * auVar51._20_4_ | (uint)!bVar47 * auVar63._20_4_);
      bVar47 = (bool)((byte)(uVar24 >> 6) & 1);
      fStack_24a8 = (float)((uint)bVar47 * auVar51._24_4_ | (uint)!bVar47 * auVar63._24_4_);
      bVar47 = SUB81(uVar24 >> 7,0);
      uStack_24a4 = (uint)bVar47 * auVar51._28_4_ | (uint)!bVar47 * auVar63._28_4_;
      auVar68._4_4_ = fVar87 * fStack_24bc;
      auVar68._0_4_ = fVar87 * local_24c0;
      auVar68._8_4_ = fVar87 * fStack_24b8;
      auVar68._12_4_ = fVar87 * fStack_24b4;
      auVar68._16_4_ = fVar87 * fStack_24b0;
      auVar68._20_4_ = fVar87 * fStack_24ac;
      auVar68._24_4_ = fVar87 * fStack_24a8;
      auVar68._28_4_ = fVar87;
      auVar15 = vfmadd213ps_fma(auVar83,local_24e0,auVar68);
      auVar15 = vfmadd213ps_fma(auVar80,local_2500,ZEXT1632(auVar15));
      auVar51 = ZEXT1632(CONCAT412(auVar15._12_4_ + auVar15._12_4_,
                                   CONCAT48(auVar15._8_4_ + auVar15._8_4_,
                                            CONCAT44(auVar15._4_4_ + auVar15._4_4_,
                                                     auVar15._0_4_ + auVar15._0_4_))));
      auVar84._0_4_ = auVar59._0_4_ * local_24c0;
      auVar84._4_4_ = auVar59._4_4_ * fStack_24bc;
      auVar84._8_4_ = auVar59._8_4_ * fStack_24b8;
      auVar84._12_4_ = auVar59._12_4_ * fStack_24b4;
      auVar84._16_4_ = auVar59._16_4_ * fStack_24b0;
      auVar84._20_4_ = auVar59._20_4_ * fStack_24ac;
      auVar84._24_4_ = auVar59._24_4_ * fStack_24a8;
      auVar84._28_4_ = 0;
      auVar15 = vfmadd213ps_fma(auVar58,local_24e0,auVar84);
      auVar16 = vfmadd213ps_fma(auVar49,local_2500,ZEXT1632(auVar15));
      auVar50 = vrcp14ps_avx512vl(auVar51);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar49._16_4_ = 0x3f800000;
      auVar49._20_4_ = 0x3f800000;
      auVar49._24_4_ = 0x3f800000;
      auVar49._28_4_ = 0x3f800000;
      auVar49 = vfnmadd213ps_avx512vl(auVar50,auVar51,auVar49);
      auVar15 = vfmadd132ps_fma(auVar49,auVar50,auVar50);
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar86._4_4_ = uVar85;
      auVar86._0_4_ = uVar85;
      auVar86._8_4_ = uVar85;
      auVar86._12_4_ = uVar85;
      auVar86._16_4_ = uVar85;
      auVar86._20_4_ = uVar85;
      auVar86._24_4_ = uVar85;
      auVar86._28_4_ = uVar85;
      auVar109 = ZEXT3264(auVar86);
      local_2440 = ZEXT1632(CONCAT412(auVar15._12_4_ * (auVar16._12_4_ + auVar16._12_4_),
                                      CONCAT48(auVar15._8_4_ * (auVar16._8_4_ + auVar16._8_4_),
                                               CONCAT44(auVar15._4_4_ *
                                                        (auVar16._4_4_ + auVar16._4_4_),
                                                        auVar15._0_4_ *
                                                        (auVar16._0_4_ + auVar16._0_4_)))));
      auVar77 = ZEXT3264(local_2440);
      uVar25 = vcmpps_avx512vl(local_2440,auVar86,2);
      uVar85 = *(undefined4 *)(ray + k * 4 + 0x30);
      auVar52._4_4_ = uVar85;
      auVar52._0_4_ = uVar85;
      auVar52._8_4_ = uVar85;
      auVar52._12_4_ = uVar85;
      auVar52._16_4_ = uVar85;
      auVar52._20_4_ = uVar85;
      auVar52._24_4_ = uVar85;
      auVar52._28_4_ = uVar85;
      uVar23 = vcmpps_avx512vl(local_2440,auVar52,0xd);
      bVar40 = (byte)uVar25 & (byte)uVar23 & bVar40;
      if (bVar40 != 0) {
        uVar43 = vcmpps_avx512vl(auVar51,_DAT_01f7b000,4);
        uVar43 = bVar40 & uVar43;
        local_24a0 = (byte)uVar43;
        if (local_24a0 != 0) {
          local_23c0 = 0xf0;
          auVar27._8_4_ = 0x219392ef;
          auVar27._0_8_ = 0x219392ef219392ef;
          auVar27._12_4_ = 0x219392ef;
          auVar27._16_4_ = 0x219392ef;
          auVar27._20_4_ = 0x219392ef;
          auVar27._24_4_ = 0x219392ef;
          auVar27._28_4_ = 0x219392ef;
          uVar48 = vcmpps_avx512vl(local_2520,auVar27,5);
          auVar50 = vrcp14ps_avx512vl(local_2520);
          auVar81._8_4_ = 0x3f800000;
          auVar81._0_8_ = 0x3f8000003f800000;
          auVar81._12_4_ = 0x3f800000;
          auVar81._16_4_ = 0x3f800000;
          auVar81._20_4_ = 0x3f800000;
          auVar81._24_4_ = 0x3f800000;
          auVar81._28_4_ = 0x3f800000;
          auVar15 = vfnmadd213ps_fma(local_2520,auVar50,auVar81);
          auVar49 = vfmadd132ps_avx512vl(ZEXT1632(auVar15),auVar50,auVar50);
          fVar95 = (float)((uint)((byte)uVar48 & 1) * auVar49._0_4_);
          fVar87 = (float)((uint)((byte)(uVar48 >> 1) & 1) * auVar49._4_4_);
          fVar92 = (float)((uint)((byte)(uVar48 >> 2) & 1) * auVar49._8_4_);
          fVar91 = (float)((uint)((byte)(uVar48 >> 3) & 1) * auVar49._12_4_);
          fVar90 = (float)((uint)((byte)(uVar48 >> 4) & 1) * auVar49._16_4_);
          fVar89 = (float)((uint)((byte)(uVar48 >> 5) & 1) * auVar49._20_4_);
          fVar102 = (float)((uint)((byte)(uVar48 >> 6) & 1) * auVar49._24_4_);
          auVar31._4_4_ = fVar87 * local_2560._4_4_;
          auVar31._0_4_ = fVar95 * local_2560._0_4_;
          auVar31._8_4_ = fVar92 * local_2560._8_4_;
          auVar31._12_4_ = fVar91 * local_2560._12_4_;
          auVar31._16_4_ = fVar90 * local_2560._16_4_;
          auVar31._20_4_ = fVar89 * local_2560._20_4_;
          auVar31._24_4_ = fVar102 * local_2560._24_4_;
          auVar31._28_4_ = local_2560._28_4_;
          auVar49 = vminps_avx(auVar31,auVar81);
          auVar32._4_4_ = fVar87 * local_2540._4_4_;
          auVar32._0_4_ = fVar95 * local_2540._0_4_;
          auVar32._8_4_ = fVar92 * local_2540._8_4_;
          auVar32._12_4_ = fVar91 * local_2540._12_4_;
          auVar32._16_4_ = fVar90 * local_2540._16_4_;
          auVar32._20_4_ = fVar89 * local_2540._20_4_;
          auVar32._24_4_ = fVar102 * local_2540._24_4_;
          auVar32._28_4_ = auVar50._28_4_;
          auVar50 = vminps_avx(auVar32,auVar81);
          auVar51 = vsubps_avx(auVar81,auVar49);
          auVar52 = vsubps_avx(auVar81,auVar50);
          local_2460 = vblendps_avx(auVar50,auVar51,0xf0);
          local_2480 = vblendps_avx(auVar49,auVar52,0xf0);
          fVar87 = (float)DAT_01fbac00;
          fVar95 = DAT_01fbac00._4_4_;
          fVar102 = DAT_01fbac00._8_4_;
          fVar89 = DAT_01fbac00._12_4_;
          fVar90 = DAT_01fbac00._16_4_;
          fVar91 = DAT_01fbac00._20_4_;
          fVar92 = DAT_01fbac00._24_4_;
          local_2420[0] = local_2500._0_4_ * fVar87;
          local_2420[1] = local_2500._4_4_ * fVar95;
          local_2420[2] = local_2500._8_4_ * fVar102;
          local_2420[3] = local_2500._12_4_ * fVar89;
          fStack_2410 = local_2500._16_4_ * fVar90;
          fStack_240c = local_2500._20_4_ * fVar91;
          fStack_2408 = local_2500._24_4_ * fVar92;
          uStack_2404 = local_2500._28_4_;
          local_2400[0] = local_24e0._0_4_ * fVar87;
          local_2400[1] = local_24e0._4_4_ * fVar95;
          local_2400[2] = local_24e0._8_4_ * fVar102;
          local_2400[3] = local_24e0._12_4_ * fVar89;
          fStack_23f0 = local_24e0._16_4_ * fVar90;
          fStack_23ec = local_24e0._20_4_ * fVar91;
          fStack_23e8 = local_24e0._24_4_ * fVar92;
          uStack_23e4 = local_24e0._28_4_;
          local_23e0[0] = local_24c0 * fVar87;
          local_23e0[1] = fStack_24bc * fVar95;
          local_23e0[2] = fStack_24b8 * fVar102;
          local_23e0[3] = fStack_24b4 * fVar89;
          fStack_23d0 = fStack_24b0 * fVar90;
          fStack_23cc = fStack_24ac * fVar91;
          fStack_23c8 = fStack_24a8 * fVar92;
          uStack_23c4 = uStack_24a4;
          auVar74._8_4_ = 0x7f800000;
          auVar74._0_8_ = 0x7f8000007f800000;
          auVar74._12_4_ = 0x7f800000;
          auVar74._16_4_ = 0x7f800000;
          auVar74._20_4_ = 0x7f800000;
          auVar74._24_4_ = 0x7f800000;
          auVar74._28_4_ = 0x7f800000;
          auVar49 = vblendmps_avx512vl(auVar74,local_2440);
          auVar72._0_4_ =
               (uint)(local_24a0 & 1) * auVar49._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 1) & 1);
          auVar72._4_4_ = (uint)bVar47 * auVar49._4_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
          auVar72._8_4_ = (uint)bVar47 * auVar49._8_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 3) & 1);
          auVar72._12_4_ = (uint)bVar47 * auVar49._12_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 4) & 1);
          auVar72._16_4_ = (uint)bVar47 * auVar49._16_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 5) & 1);
          auVar72._20_4_ = (uint)bVar47 * auVar49._20_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = (bool)((byte)(uVar43 >> 6) & 1);
          auVar72._24_4_ = (uint)bVar47 * auVar49._24_4_ | (uint)!bVar47 * 0x7f800000;
          bVar47 = SUB81(uVar43 >> 7,0);
          auVar72._28_4_ = (uint)bVar47 * auVar49._28_4_ | (uint)!bVar47 * 0x7f800000;
          auVar49 = vshufps_avx(auVar72,auVar72,0xb1);
          auVar49 = vminps_avx(auVar72,auVar49);
          auVar50 = vshufpd_avx(auVar49,auVar49,5);
          auVar49 = vminps_avx(auVar49,auVar50);
          auVar50 = vpermpd_avx2(auVar49,0x4e);
          auVar49 = vminps_avx(auVar49,auVar50);
          uVar25 = vcmpps_avx512vl(auVar72,auVar49,0);
          uVar41 = (uint)uVar43;
          if (((byte)uVar25 & local_24a0) != 0) {
            uVar41 = (uint)((byte)uVar25 & local_24a0);
          }
          uVar38 = 0;
          for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
            uVar38 = uVar38 + 1;
          }
          do {
            uVar42 = uVar38 & 0xff;
            uVar41 = *(uint *)((long)&local_2580 + (ulong)uVar42 * 4);
            local_2830 = (pSVar3->geometries).items[uVar41].ptr;
            if ((local_2830->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar43 = (ulong)(byte)(~(byte)(1 << (uVar38 & 0x1f)) & (byte)uVar43);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_2830->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar43 = (ulong)(uVar42 << 2);
                uVar85 = *(undefined4 *)(local_2480 + uVar43);
                uVar2 = *(undefined4 *)(local_2460 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_23e0 + uVar43);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar85;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_26c0 + uVar43);
                *(uint *)(ray + k * 4 + 0x120) = uVar41;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              uVar48 = (ulong)(uVar42 * 4);
              uVar85 = *(undefined4 *)(local_2480 + uVar48);
              local_2660._4_4_ = uVar85;
              local_2660._0_4_ = uVar85;
              local_2660._8_4_ = uVar85;
              local_2660._12_4_ = uVar85;
              local_2650 = *(undefined4 *)(local_2460 + uVar48);
              local_2630 = vpbroadcastd_avx512vl();
              uVar85 = *(undefined4 *)((long)&local_26c0 + uVar48);
              local_2640._4_4_ = uVar85;
              local_2640._0_4_ = uVar85;
              local_2640._8_4_ = uVar85;
              local_2640._12_4_ = uVar85;
              uVar85 = *(undefined4 *)((long)local_2420 + uVar48);
              uVar2 = *(undefined4 *)((long)local_2400 + uVar48);
              local_2680._4_4_ = uVar2;
              local_2680._0_4_ = uVar2;
              local_2680._8_4_ = uVar2;
              local_2680._12_4_ = uVar2;
              uVar2 = *(undefined4 *)((long)local_23e0 + uVar48);
              local_2670._4_4_ = uVar2;
              local_2670._0_4_ = uVar2;
              local_2670._8_4_ = uVar2;
              local_2670._12_4_ = uVar2;
              local_2690[0] = (RTCHitN)(char)uVar85;
              local_2690[1] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2690[2] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2690[3] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2690[4] = (RTCHitN)(char)uVar85;
              local_2690[5] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2690[6] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2690[7] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2690[8] = (RTCHitN)(char)uVar85;
              local_2690[9] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2690[10] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2690[0xb] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              local_2690[0xc] = (RTCHitN)(char)uVar85;
              local_2690[0xd] = (RTCHitN)(char)((uint)uVar85 >> 8);
              local_2690[0xe] = (RTCHitN)(char)((uint)uVar85 >> 0x10);
              local_2690[0xf] = (RTCHitN)(char)((uint)uVar85 >> 0x18);
              uStack_264c = local_2650;
              uStack_2648 = local_2650;
              uStack_2644 = local_2650;
              vpcmpeqd_avx2(ZEXT1632(local_2660),ZEXT1632(local_2660));
              uStack_261c = context->user->instID[0];
              local_2620 = uStack_261c;
              uStack_2618 = uStack_261c;
              uStack_2614 = uStack_261c;
              uStack_2610 = context->user->instPrimID[0];
              uStack_260c = uStack_2610;
              uStack_2608 = uStack_2610;
              uStack_2604 = uStack_2610;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar48);
              local_2840 = local_2710;
              local_2810.valid = (int *)local_2840;
              local_2810.geometryUserPtr = local_2830->userPtr;
              local_2810.context = context->user;
              local_2810.hit = local_2690;
              local_2810.N = 4;
              local_26e0 = auVar77._0_32_;
              local_2700 = auVar109._0_32_;
              local_2810.ray = (RTCRayN *)ray;
              if (local_2830->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_2830->intersectionFilterN)(&local_2810);
                auVar109 = ZEXT3264(local_2700);
                auVar77 = ZEXT3264(local_26e0);
                auVar117 = ZEXT3264(local_27e0);
                auVar116 = ZEXT3264(local_27c0);
                auVar115 = ZEXT3264(local_27a0);
                auVar114 = ZEXT3264(local_2780);
                auVar113 = ZEXT3264(local_2760);
                auVar112 = ZEXT3264(local_2740);
              }
              uVar48 = vptestmd_avx512vl(local_2840,local_2840);
              if ((uVar48 & 0xf) == 0) {
LAB_01db7963:
                *(int *)(ray + k * 4 + 0x80) = auVar109._0_4_;
              }
              else {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_2830->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var9)(&local_2810);
                  auVar109 = ZEXT3264(local_2700);
                  auVar77 = ZEXT3264(local_26e0);
                  auVar117 = ZEXT3264(local_27e0);
                  auVar116 = ZEXT3264(local_27c0);
                  auVar115 = ZEXT3264(local_27a0);
                  auVar114 = ZEXT3264(local_2780);
                  auVar113 = ZEXT3264(local_2760);
                  auVar112 = ZEXT3264(local_2740);
                }
                uVar48 = vptestmd_avx512vl(local_2840,local_2840);
                uVar48 = uVar48 & 0xf;
                bVar40 = (byte)uVar48;
                if (bVar40 == 0) goto LAB_01db7963;
                iVar1 = *(int *)(local_2810.hit + 4);
                iVar33 = *(int *)(local_2810.hit + 8);
                iVar34 = *(int *)(local_2810.hit + 0xc);
                bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar11 = SUB81(uVar48 >> 3,0);
                *(uint *)(local_2810.ray + 0xc0) =
                     (uint)(bVar40 & 1) * *(int *)local_2810.hit |
                     (uint)!(bool)(bVar40 & 1) * *(int *)(local_2810.ray + 0xc0);
                *(uint *)(local_2810.ray + 0xc4) =
                     (uint)bVar47 * iVar1 | (uint)!bVar47 * *(int *)(local_2810.ray + 0xc4);
                *(uint *)(local_2810.ray + 200) =
                     (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_2810.ray + 200);
                *(uint *)(local_2810.ray + 0xcc) =
                     (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xcc);
                iVar1 = *(int *)(local_2810.hit + 0x14);
                iVar33 = *(int *)(local_2810.hit + 0x18);
                iVar34 = *(int *)(local_2810.hit + 0x1c);
                bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar11 = SUB81(uVar48 >> 3,0);
                *(uint *)(local_2810.ray + 0xd0) =
                     (uint)(bVar40 & 1) * *(int *)(local_2810.hit + 0x10) |
                     (uint)!(bool)(bVar40 & 1) * *(int *)(local_2810.ray + 0xd0);
                *(uint *)(local_2810.ray + 0xd4) =
                     (uint)bVar47 * iVar1 | (uint)!bVar47 * *(int *)(local_2810.ray + 0xd4);
                *(uint *)(local_2810.ray + 0xd8) =
                     (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xd8);
                *(uint *)(local_2810.ray + 0xdc) =
                     (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xdc);
                iVar1 = *(int *)(local_2810.hit + 0x24);
                iVar33 = *(int *)(local_2810.hit + 0x28);
                iVar34 = *(int *)(local_2810.hit + 0x2c);
                bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar11 = SUB81(uVar48 >> 3,0);
                *(uint *)(local_2810.ray + 0xe0) =
                     (uint)(bVar40 & 1) * *(int *)(local_2810.hit + 0x20) |
                     (uint)!(bool)(bVar40 & 1) * *(int *)(local_2810.ray + 0xe0);
                *(uint *)(local_2810.ray + 0xe4) =
                     (uint)bVar47 * iVar1 | (uint)!bVar47 * *(int *)(local_2810.ray + 0xe4);
                *(uint *)(local_2810.ray + 0xe8) =
                     (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xe8);
                *(uint *)(local_2810.ray + 0xec) =
                     (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xec);
                iVar1 = *(int *)(local_2810.hit + 0x34);
                iVar33 = *(int *)(local_2810.hit + 0x38);
                iVar34 = *(int *)(local_2810.hit + 0x3c);
                bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar11 = SUB81(uVar48 >> 3,0);
                *(uint *)(local_2810.ray + 0xf0) =
                     (uint)(bVar40 & 1) * *(int *)(local_2810.hit + 0x30) |
                     (uint)!(bool)(bVar40 & 1) * *(int *)(local_2810.ray + 0xf0);
                *(uint *)(local_2810.ray + 0xf4) =
                     (uint)bVar47 * iVar1 | (uint)!bVar47 * *(int *)(local_2810.ray + 0xf4);
                *(uint *)(local_2810.ray + 0xf8) =
                     (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_2810.ray + 0xf8);
                *(uint *)(local_2810.ray + 0xfc) =
                     (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_2810.ray + 0xfc);
                iVar1 = *(int *)(local_2810.hit + 0x44);
                iVar33 = *(int *)(local_2810.hit + 0x48);
                iVar34 = *(int *)(local_2810.hit + 0x4c);
                bVar47 = (bool)((byte)(uVar48 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
                bVar11 = SUB81(uVar48 >> 3,0);
                *(uint *)(local_2810.ray + 0x100) =
                     (uint)(bVar40 & 1) * *(int *)(local_2810.hit + 0x40) |
                     (uint)!(bool)(bVar40 & 1) * *(int *)(local_2810.ray + 0x100);
                *(uint *)(local_2810.ray + 0x104) =
                     (uint)bVar47 * iVar1 | (uint)!bVar47 * *(int *)(local_2810.ray + 0x104);
                *(uint *)(local_2810.ray + 0x108) =
                     (uint)bVar10 * iVar33 | (uint)!bVar10 * *(int *)(local_2810.ray + 0x108);
                *(uint *)(local_2810.ray + 0x10c) =
                     (uint)bVar11 * iVar34 | (uint)!bVar11 * *(int *)(local_2810.ray + 0x10c);
                auVar15 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar15;
                auVar15 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar15;
                auVar15 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar15;
                auVar15 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar15;
                auVar109 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
              }
              uVar85 = auVar109._0_4_;
              auVar76._4_4_ = uVar85;
              auVar76._0_4_ = uVar85;
              auVar76._8_4_ = uVar85;
              auVar76._12_4_ = uVar85;
              auVar76._16_4_ = uVar85;
              auVar76._20_4_ = uVar85;
              auVar76._24_4_ = uVar85;
              auVar76._28_4_ = uVar85;
              uVar48 = vcmpps_avx512vl(auVar77._0_32_,auVar76,2);
              uVar43 = (byte)(~(byte)(1 << (uVar38 & 0x1f)) & (byte)uVar43) & uVar48;
            }
            bVar40 = (byte)uVar43;
            if (bVar40 == 0) break;
            auVar75._8_4_ = 0x7f800000;
            auVar75._0_8_ = 0x7f8000007f800000;
            auVar75._12_4_ = 0x7f800000;
            auVar75._16_4_ = 0x7f800000;
            auVar75._20_4_ = 0x7f800000;
            auVar75._24_4_ = 0x7f800000;
            auVar75._28_4_ = 0x7f800000;
            auVar49 = vblendmps_avx512vl(auVar75,auVar77._0_32_);
            auVar73._0_4_ =
                 (uint)(bVar40 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar40 & 1) * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 1) & 1);
            auVar73._4_4_ = (uint)bVar47 * auVar49._4_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
            auVar73._8_4_ = (uint)bVar47 * auVar49._8_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 3) & 1);
            auVar73._12_4_ = (uint)bVar47 * auVar49._12_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 4) & 1);
            auVar73._16_4_ = (uint)bVar47 * auVar49._16_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 5) & 1);
            auVar73._20_4_ = (uint)bVar47 * auVar49._20_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = (bool)((byte)(uVar43 >> 6) & 1);
            auVar73._24_4_ = (uint)bVar47 * auVar49._24_4_ | (uint)!bVar47 * 0x7f800000;
            bVar47 = SUB81(uVar43 >> 7,0);
            auVar73._28_4_ = (uint)bVar47 * auVar49._28_4_ | (uint)!bVar47 * 0x7f800000;
            auVar49 = vshufps_avx(auVar73,auVar73,0xb1);
            auVar49 = vminps_avx(auVar73,auVar49);
            auVar50 = vshufpd_avx(auVar49,auVar49,5);
            auVar49 = vminps_avx(auVar49,auVar50);
            auVar50 = vpermpd_avx2(auVar49,0x4e);
            auVar49 = vminps_avx(auVar49,auVar50);
            uVar25 = vcmpps_avx512vl(auVar73,auVar49,0);
            bVar40 = (byte)uVar25 & bVar40;
            uVar41 = (uint)uVar43;
            if (bVar40 != 0) {
              uVar41 = (uint)bVar40;
            }
            uVar38 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
              uVar38 = uVar38 + 1;
            }
          } while( true );
        }
      }
    }
    auVar109 = ZEXT3264(local_2600);
    uVar43 = local_2828;
    fVar87 = local_25a0;
    fVar89 = fStack_259c;
    fVar90 = fStack_2598;
    fVar91 = fStack_2594;
    fVar92 = fStack_2590;
    fVar93 = fStack_258c;
    fVar94 = fStack_2588;
    fVar95 = local_25c0;
    fVar96 = fStack_25bc;
    fVar97 = fStack_25b8;
    fVar98 = fStack_25b4;
    fVar99 = fStack_25b0;
    fVar100 = fStack_25ac;
    fVar101 = fStack_25a8;
    fVar102 = local_25e0;
    fVar103 = fStack_25dc;
    fVar104 = fStack_25d8;
    fVar105 = fStack_25d4;
    fVar106 = fStack_25d0;
    fVar107 = fStack_25cc;
    fVar108 = fStack_25c8;
  }
  uVar85 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar77 = ZEXT3264(CONCAT428(uVar85,CONCAT424(uVar85,CONCAT420(uVar85,CONCAT416(uVar85,CONCAT412(
                                                  uVar85,CONCAT48(uVar85,CONCAT44(uVar85,uVar85)))))
                                               )));
  auVar49 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar110 = ZEXT3264(auVar49);
  auVar111 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01db6c24;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }